

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddGroup.c
# Opt level: O0

int zddGroupSiftingBackward(DdManager *table,Move *moves,int size)

{
  Move *pMVar1;
  int iVar2;
  Move *pMStack_30;
  int res;
  Move *move;
  int size_local;
  Move *moves_local;
  DdManager *table_local;
  
  move._4_4_ = size;
  for (pMStack_30 = moves; pMVar1 = moves, pMStack_30 != (Move *)0x0; pMStack_30 = pMStack_30->next)
  {
    if (pMStack_30->size < move._4_4_) {
      move._4_4_ = pMStack_30->size;
    }
  }
  while( true ) {
    pMStack_30 = pMVar1;
    if (pMStack_30 == (Move *)0x0) {
      return 1;
    }
    if (pMStack_30->size == move._4_4_) break;
    if ((table->subtableZ[pMStack_30->x].next == pMStack_30->x) &&
       (table->subtableZ[pMStack_30->y].next == pMStack_30->y)) {
      iVar2 = cuddZddSwapInPlace(table,pMStack_30->x,pMStack_30->y);
      if (iVar2 == 0) {
        return 0;
      }
    }
    else {
      iVar2 = zddGroupMoveBackward(table,pMStack_30->x,pMStack_30->y);
      if (iVar2 == 0) {
        return 0;
      }
    }
    pMVar1 = pMStack_30->next;
  }
  return 1;
}

Assistant:

static int
zddGroupSiftingBackward(
  DdManager * table,
  Move * moves,
  int  size)
{
    Move *move;
    int  res;


    for (move = moves; move != NULL; move = move->next) {
        if (move->size < size) {
            size = move->size;
        }
    }

    for (move = moves; move != NULL; move = move->next) {
        if (move->size == size) return(1);
        if ((table->subtableZ[move->x].next == move->x) &&
        (table->subtableZ[move->y].next == move->y)) {
            res = cuddZddSwapInPlace(table,(int)move->x,(int)move->y);
            if (!res) return(0);
#ifdef DD_DEBUG
            if (pr > 0) (void) fprintf(table->out,"zddGroupSiftingBackward:\n");
            assert(table->subtableZ[move->x].next == move->x);
            assert(table->subtableZ[move->y].next == move->y);
#endif
        } else { /* Group move necessary */
            res = zddGroupMoveBackward(table,(int)move->x,(int)move->y);
            if (!res) return(0);
        }
    }

    return(1);

}